

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ct.cpp
# Opt level: O0

void UConverter_toUnicode_CompoundText_OFFSETS(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  uint8_t uVar1;
  char cVar2;
  UChar *sourceLimit;
  void *pvVar3;
  UConverter *pUVar4;
  UChar UVar5;
  UBool UVar6;
  COMPOUND_TEXT_CONVERTERS CVar7;
  int32_t iVar8;
  size_t sVar9;
  uint local_94;
  undefined1 local_90 [4];
  int32_t minArgsSize;
  UConverterToUnicodeArgs subArgs;
  UConverterSharedData *savedSharedData;
  UConverterDataCompoundText *myConverterData;
  int32_t sourceOffset;
  COMPOUND_TEXT_CONVERTERS tmpState;
  COMPOUND_TEXT_CONVERTERS currentState;
  uint32_t mySourceChar;
  char *tmpSourceLimit;
  char *mySourceLimit;
  UChar *myTarget;
  char *mySource;
  UErrorCode *err_local;
  UConverterToUnicodeArgs *args_local;
  
  myTarget = (UChar *)args->source;
  mySourceLimit = (char *)args->target;
  sourceLimit = (UChar *)args->sourceLimit;
  pvVar3 = args->converter->extraInfo;
  subArgs.offsets = (int32_t *)0x0;
  if (args->size < 0x38) {
    local_94 = (uint)args->size;
  }
  else {
    local_94 = 0x38;
  }
  memcpy(local_90,args,(long)(int)local_94);
  local_90._0_2_ = (undefined2)local_94;
  sourceOffset = *(int32_t *)((long)pvVar3 + 0xa0);
LAB_0037f27f:
  do {
    do {
      if (sourceLimit <= myTarget) goto LAB_0037f567;
      if (args->targetLimit <= mySourceLimit) {
        *err = U_BUFFER_OVERFLOW_ERROR;
        goto LAB_0037f567;
      }
      if (args->converter->toULength < '\x01') {
        uVar1 = (uint8_t)*myTarget;
      }
      else {
        uVar1 = args->converter->toUBytes[0];
      }
      if (uVar1 == '\x1b') {
        CVar7 = findStateFromEscSeq((char *)myTarget,(char *)sourceLimit,args->converter->toUBytes,
                                    (int)args->converter->toULength,err);
        if (*err == U_TRUNCATED_CHAR_FOUND) goto LAB_0037f30c;
        if (CVar7 == INVALID) {
          if (args->converter->toULength == '\0') {
            myTarget = (UChar *)((long)myTarget + 1);
          }
          *err = U_ILLEGAL_CHAR_FOUND;
          goto LAB_0037f567;
        }
        if (CVar7 != sourceOffset) {
          sourceOffset = CVar7;
        }
        sVar9 = strlen((char *)(escSeqCompoundText + sourceOffset));
        myTarget = (UChar *)((long)myTarget + (long)((int)sVar9 - (int)args->converter->toULength));
        args->converter->toULength = '\0';
      }
      if (sourceOffset == 0) {
        while( true ) {
          if ((sourceLimit <= myTarget) || ((char)*myTarget == '\x1b')) goto LAB_0037f27f;
          if (args->targetLimit <= mySourceLimit) break;
          *(ushort *)mySourceLimit = (ushort)(byte)*myTarget;
          mySourceLimit = mySourceLimit + 2;
          myTarget = (UChar *)((long)myTarget + 1);
        }
        *err = U_BUFFER_OVERFLOW_ERROR;
        goto LAB_0037f27f;
      }
    } while (sourceLimit <= myTarget);
    iVar8 = findNextEsc((char *)myTarget,(char *)sourceLimit);
    subArgs.source = (char *)((long)myTarget + (long)iVar8);
    subArgs.converter = (UConverter *)myTarget;
    subArgs.sourceLimit = mySourceLimit;
    subArgs.offsets = *(int32_t **)(subArgs._0_8_ + 0x30);
    *(undefined8 *)(subArgs._0_8_ + 0x30) = *(undefined8 *)((long)pvVar3 + (long)sourceOffset * 8);
    ucnv_MBCSToUnicodeWithOffsets_63((UConverterToUnicodeArgs *)local_90,err);
    *(int32_t **)(subArgs._0_8_ + 0x30) = subArgs.offsets;
    myTarget = (UChar *)subArgs.converter;
    mySourceLimit = subArgs.sourceLimit;
    UVar6 = U_FAILURE(*err);
  } while (UVar6 == '\0');
  if (*err == U_BUFFER_OVERFLOW_ERROR) {
    if ('\0' < *(char *)(subArgs._0_8_ + 0x5d)) {
      memcpy(args->converter->UCharErrorBuffer,(void *)(subArgs._0_8_ + 0x90),
             (long)*(char *)(subArgs._0_8_ + 0x5d));
    }
    args->converter->UCharErrorBufferLength = *(int8_t *)(subArgs._0_8_ + 0x5d);
    *(undefined1 *)(subArgs._0_8_ + 0x5d) = 0;
  }
LAB_0037f567:
  *(int32_t *)((long)pvVar3 + 0xa0) = sourceOffset;
  args->target = (UChar *)mySourceLimit;
  args->source = (char *)myTarget;
  return;
LAB_0037f30c:
  while (myTarget < sourceLimit) {
    UVar5 = *myTarget;
    pUVar4 = args->converter;
    cVar2 = args->converter->toULength;
    args->converter->toULength = cVar2 + '\x01';
    pUVar4->toUBytes[cVar2] = (uint8_t)UVar5;
    myTarget = (UChar *)((long)myTarget + 1);
  }
  *err = U_ZERO_ERROR;
  goto LAB_0037f567;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_CompoundText_OFFSETS(UConverterToUnicodeArgs *args,
                                               UErrorCode* err){
    const char *mySource = (char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    const char *tmpSourceLimit = mySourceLimit;
    uint32_t mySourceChar = 0x0000;
    COMPOUND_TEXT_CONVERTERS currentState, tmpState;
    int32_t sourceOffset = 0;
    UConverterDataCompoundText *myConverterData = (UConverterDataCompoundText *) args->converter->extraInfo;
    UConverterSharedData* savedSharedData = NULL;

    UConverterToUnicodeArgs subArgs;
    int32_t minArgsSize;

    /* set up the subconverter arguments */
    if(args->size<sizeof(UConverterToUnicodeArgs)) {
        minArgsSize = args->size;
    } else {
        minArgsSize = (int32_t)sizeof(UConverterToUnicodeArgs);
    }

    uprv_memcpy(&subArgs, args, minArgsSize);
    subArgs.size = (uint16_t)minArgsSize;

    currentState = tmpState =  myConverterData->state;

    while(mySource < mySourceLimit){
        if(myTarget < args->targetLimit){
            if (args->converter->toULength > 0) {
                mySourceChar = args->converter->toUBytes[0];
            } else {
                mySourceChar = (uint8_t)*mySource;
            }

            if (mySourceChar == ESC_START) {
                tmpState = findStateFromEscSeq(mySource, mySourceLimit, args->converter->toUBytes, args->converter->toULength, err);

                if (*err == U_TRUNCATED_CHAR_FOUND) {
                    for (; mySource < mySourceLimit;) {
                        args->converter->toUBytes[args->converter->toULength++] = *mySource++;
                    }
                    *err = U_ZERO_ERROR;
                    break;
                } else if (tmpState == INVALID) {
                    if (args->converter->toULength == 0) {
                        mySource++; /* skip over the 0x1b byte */
                    }
                    *err = U_ILLEGAL_CHAR_FOUND;
                    break;
                }

                if (tmpState != currentState) {
                    currentState = tmpState;
                }

                sourceOffset = static_cast<int32_t>(uprv_strlen((char*)escSeqCompoundText[currentState]) - args->converter->toULength);

                mySource += sourceOffset;

                args->converter->toULength = 0;
            }

            if (currentState == COMPOUND_TEXT_SINGLE_0) {
                while (mySource < mySourceLimit) {
                    if (*mySource == ESC_START) {
                        break;
                    }
                    if (myTarget < args->targetLimit) {
                        *myTarget++ = 0x00ff&(*mySource++);
                    } else {
                        *err = U_BUFFER_OVERFLOW_ERROR;
                        break;
                    }
                }
            } else if (mySource < mySourceLimit){
                sourceOffset = findNextEsc(mySource, mySourceLimit);

                tmpSourceLimit = mySource + sourceOffset;

                subArgs.source = mySource;
                subArgs.sourceLimit = tmpSourceLimit;
                subArgs.target = myTarget;
                savedSharedData = subArgs.converter->sharedData;
                subArgs.converter->sharedData = myConverterData->myConverterArray[currentState];

                ucnv_MBCSToUnicodeWithOffsets(&subArgs, err);

                subArgs.converter->sharedData = savedSharedData;

                mySource = subArgs.source;
                myTarget = subArgs.target;

                if (U_FAILURE(*err)) {
                    if(*err == U_BUFFER_OVERFLOW_ERROR) {
                        if(subArgs.converter->UCharErrorBufferLength > 0) {
                            uprv_memcpy(args->converter->UCharErrorBuffer, subArgs.converter->UCharErrorBuffer,
                                        subArgs.converter->UCharErrorBufferLength);
                        }
                        args->converter->UCharErrorBufferLength=subArgs.converter->UCharErrorBufferLength;
                        subArgs.converter->UCharErrorBufferLength = 0;
                    }
                    break;
                }
            }
        } else {
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
    myConverterData->state = currentState;
    args->target = myTarget;
    args->source = mySource;
}